

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O3

void __thiscall cmFileInstaller::cmFileInstaller(cmFileInstaller *this,cmExecutionStatus *status)

{
  cmMakefile *this_00;
  bool bVar1;
  char *extraout_RDX;
  string_view value;
  string install_always;
  string local_70;
  string local_50;
  
  cmFileCopier::cmFileCopier(&this->super_cmFileCopier,status,"INSTALL");
  (this->super_cmFileCopier)._vptr_cmFileCopier = (_func_int **)&PTR__cmFileInstaller_00a8ea00;
  *(undefined4 *)&(this->super_cmFileCopier).field_0xf4 = 4;
  this->InstallMode = COPY;
  this->Optional = false;
  this->MessageAlways = false;
  this->MessageLazy = false;
  this->MessageNever = false;
  this->DestDirLength = 0;
  (this->Rename)._M_dataplus._M_p = (pointer)&(this->Rename).field_2;
  (this->Rename)._M_string_length = 0;
  (this->Rename).field_2._M_local_buf[0] = '\0';
  (this->Manifest)._M_dataplus._M_p = (pointer)&(this->Manifest).field_2;
  (this->Manifest)._M_string_length = 0;
  (this->Manifest).field_2._M_local_buf[0] = '\0';
  (this->super_cmFileCopier).UseSourcePermissions = false;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  bVar1 = cmsys::SystemTools::GetEnv("CMAKE_INSTALL_ALWAYS",&local_70);
  if (bVar1) {
    value._M_str = extraout_RDX;
    value._M_len = (size_t)local_70._M_dataplus._M_p;
    bVar1 = cmValue::IsOn((cmValue *)local_70._M_string_length,value);
    (this->super_cmFileCopier).Always = bVar1;
  }
  this_00 = (this->super_cmFileCopier).Makefile;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"CMAKE_INSTALL_MANIFEST_FILES","");
  cmMakefile::GetSafeDefinition(this_00,&local_50);
  std::__cxx11::string::_M_assign((string *)&this->Manifest);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

cmFileInstaller::cmFileInstaller(cmExecutionStatus& status)
  : cmFileCopier(status, "INSTALL")
{
  // Installation does not use source permissions by default.
  this->UseSourcePermissions = false;
  // Check whether to copy files always or only if they have changed.
  std::string install_always;
  if (cmSystemTools::GetEnv("CMAKE_INSTALL_ALWAYS", install_always)) {
    this->Always = cmIsOn(install_always);
  }
  // Get the current manifest.
  this->Manifest =
    this->Makefile->GetSafeDefinition("CMAKE_INSTALL_MANIFEST_FILES");
}